

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_job * ma_job_init(ma_job *__return_storage_ptr__,ma_uint16 code)

{
  ma_uint16 code_local;
  
  memset(__return_storage_ptr__,0,0x68);
  (__return_storage_ptr__->toc).breakup.code = code;
  (__return_storage_ptr__->toc).breakup.slot = 0xffff;
  __return_storage_ptr__->next = 0xffffffffffffffff;
  return __return_storage_ptr__;
}

Assistant:

MA_API ma_job ma_job_init(ma_uint16 code)
{
    ma_job job;

    MA_ZERO_OBJECT(&job);
    job.toc.breakup.code = code;
    job.toc.breakup.slot = MA_JOB_SLOT_NONE;    /* Temp value. Will be allocated when posted to a queue. */
    job.next             = MA_JOB_ID_NONE;

    return job;
}